

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

global_object_create_result *
mjs::anon_unknown_35::make_math_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  long *plVar1;
  function_object *pfVar2;
  void *pvVar3;
  gc_heap_ptr<mjs::gc_function> p;
  gc_heap_ptr<mjs::function_object> o;
  object_ptr math;
  undefined1 auStack_b8 [16];
  gc_heap_ptr_untyped local_a8;
  gc_heap_ptr_untyped local_98;
  string_view local_88;
  gc_heap_ptr_untyped local_78;
  undefined1 local_68 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_60;
  undefined1 local_40 [24];
  char *local_28;
  
  h = (global->super_gc_heap_ptr_untyped).heap_;
  gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::make_object((global_object *)local_40);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 1;
  local_88._M_str = "E";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x4005bf0a8b145769;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 4;
  local_88._M_str = "LN10";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x40026bb1bbb55516;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 3;
  local_88._M_str = "LN2";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x3fe62e42fefa39ef;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 5;
  local_88._M_str = "LOG2E";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x3ff71547652b82fe;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 6;
  local_88._M_str = "LOG10E";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x3fdbcb7b1526e50e;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 2;
  local_88._M_str = "PI";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x400921fb54442d18;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 7;
  local_88._M_str = "SQRT1_2";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x3fe6a09e667f3bcd;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  local_88._M_len = 5;
  local_88._M_str = "SQRT2";
  string::string((string *)auStack_b8,h,&local_88);
  local_68._0_4_ = number;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x3ff6a09e667f3bcd;
  (**(code **)(*plVar1 + 8))(plVar1,auStack_b8,local_68,7);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "abs";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8c50;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 4;
  local_40._20_4_ = 0;
  local_28 = "acos";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8c90;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 4;
  local_40._20_4_ = 0;
  local_28 = "asin";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8cd0;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 4;
  local_40._20_4_ = 0;
  local_28 = "atan";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8d10;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 5;
  local_40._20_4_ = 0;
  local_28 = "atan2";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8d50;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 4;
  local_40._20_4_ = 0;
  local_28 = "ceil";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8d90;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "cos";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8dd0;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "exp";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8e10;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 5;
  local_40._20_4_ = 0;
  local_28 = "floor";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8e50;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "log";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8e90;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "pow";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8ed0;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "sin";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8f10;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 4;
  local_40._20_4_ = 0;
  local_28 = "sqrt";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8f50;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "tan";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8f90;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "min";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d8fd0;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 3;
  local_40._20_4_ = 0;
  local_28 = "max";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d9010;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 5;
  local_40._20_4_ = 0;
  local_28 = "round";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d9050;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  local_40._16_4_ = 6;
  local_40._20_4_ = 0;
  local_28 = "random";
  string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)(local_40 + 0x10));
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  make_raw_function((mjs *)(auStack_b8 + 0x10),global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  local_88._M_len = 0;
  local_88._M_str = (char *)((ulong)local_88._M_str & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)auStack_b8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_b8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001d9090;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)auStack_b8,
             (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_88,0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
  local_98.heap_ = local_a8.heap_;
  local_98.pos_ = local_a8.pos_;
  if ((slot *)local_a8.heap_ == (slot *)0x0) {
    local_68._0_4_ = object;
    local_60.n_ = 0.0;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
  }
  else {
    gc_heap::attach(local_a8.heap_,&local_98);
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
    if ((slot *)local_98.heap_ != (slot *)0x0) {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,&local_78,local_68,2);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_b8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_40._0_8_;
  (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.pos_ = local_40._8_4_;
  if ((gc_heap *)local_40._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_40._0_8_,(gc_heap_ptr_untyped *)__return_storage_ptr__);
  }
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = 0;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_40);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_math_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto math = global->make_object();

    math->put(string{h, "E"},       value{2.7182818284590452354},  global_object::prototype_attributes);
    math->put(string{h, "LN10"},    value{2.302585092994046},      global_object::prototype_attributes);
    math->put(string{h, "LN2"},     value{0.6931471805599453},     global_object::prototype_attributes);
    math->put(string{h, "LOG2E"},   value{1.4426950408889634},     global_object::prototype_attributes);
    math->put(string{h, "LOG10E"},  value{0.4342944819032518},     global_object::prototype_attributes);
    math->put(string{h, "PI"},      value{3.14159265358979323846}, global_object::prototype_attributes);
    math->put(string{h, "SQRT1_2"}, value{0.7071067811865476},     global_object::prototype_attributes);
    math->put(string{h, "SQRT2"},   value{1.4142135623730951},     global_object::prototype_attributes);


    auto make_math_function1 = [&](const char* name, auto f) {
        put_native_function(global, math, name, [f](const value&, const std::vector<value>& args){
            return value{f(to_number(get_arg(args, 0)))};
        }, 1);
    };
    auto make_math_function2 = [&](const char* name, auto f) {
        put_native_function(global, math, name, [f](const value&, const std::vector<value>& args){
            return value{f(to_number(get_arg(args, 0)), to_number(get_arg(args, 1)))};
        }, 2);
    };

#define MATH_IMPL_1(name) make_math_function1(#name, [](double x) { return std::name(x); })
#define MATH_IMPL_2(name) make_math_function2(#name, [](double x, double y) { return std::name(x, y); })

    MATH_IMPL_1(abs);
    MATH_IMPL_1(acos);
    MATH_IMPL_1(asin);
    MATH_IMPL_1(atan);
    MATH_IMPL_2(atan2);
    MATH_IMPL_1(ceil);
    MATH_IMPL_1(cos);
    MATH_IMPL_1(exp);
    MATH_IMPL_1(floor);
    MATH_IMPL_1(log);
    MATH_IMPL_2(pow);
    MATH_IMPL_1(sin);
    MATH_IMPL_1(sqrt);
    MATH_IMPL_1(tan);

#undef MATH_IMPL_1
#undef MATH_IMPL_2

    make_math_function2("min", [](double x, double y) {
        return y >= x ? x: y;
    });
    make_math_function2("max", [](double x, double y) {
        return y < x ? x: y;
    });
    make_math_function1("round", [](double x) {
        if (x >= 0 && x < 0.5) return +0.0;
        if (x < 0 && x >= -0.5) return -0.0;
        return std::floor(x+0.5);
    });

    put_native_function(global, math, "random", [](const value&, const std::vector<value>&){
        return value{static_cast<double>(rand()) / (1.+RAND_MAX)};
    }, 0);

    return { math, nullptr };
}